

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

void memSwap(void *buf1,void *buf2,size_t count)

{
  size_t count_local;
  void *buf2_local;
  void *buf1_local;
  
  buf2_local = buf2;
  buf1_local = buf1;
  for (count_local = count; 7 < count_local; count_local = count_local - 8) {
    *(ulong *)buf1_local = *buf2_local ^ *buf1_local;
    *(ulong *)buf2_local = *buf1_local ^ *buf2_local;
    *(ulong *)buf1_local = *buf2_local ^ *buf1_local;
    buf1_local = (void *)((long)buf1_local + 8);
    buf2_local = (void *)((long)buf2_local + 8);
  }
  while (count_local != 0) {
    *(byte *)buf1_local = *buf1_local ^ *buf2_local;
    *(byte *)buf2_local = *buf2_local ^ *buf1_local;
    *(byte *)buf1_local = *buf1_local ^ *buf2_local;
    buf1_local = (void *)((long)buf1_local + 1);
    buf2_local = (void *)((long)buf2_local + 1);
    count_local = count_local - 1;
  }
  return;
}

Assistant:

void memSwap(void* buf1, void* buf2, size_t count)
{
	ASSERT(memIsDisjoint(buf1, buf2, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		SWAP(*(word*)buf1, *(word*)buf2);
		buf1 = (word*)buf1 + 1;
		buf2 = (word*)buf2 + 1;
	}
	while (count--)
	{
		SWAP(*(octet*)buf1, *(octet*)buf2);
		buf1 = (octet*)buf1 + 1;
		buf2 = (octet*)buf2 + 1;
	}
}